

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

void __thiscall
llvm::SMDiagnostic::SMDiagnostic
          (SMDiagnostic *this,SourceMgr *sm,SMLoc L,StringRef FN,int Line,int Col,DiagKind Kind,
          StringRef Msg,StringRef LineStr,ArrayRef<std::pair<unsigned_int,_unsigned_int>_> Ranges,
          ArrayRef<llvm::SMFixIt> Hints)

{
  void *pvVar1;
  StringRef local_30;
  
  local_30.Length = FN.Length;
  local_30.Data = FN.Data;
  this->SM = sm;
  (this->Loc).Ptr = L.Ptr;
  StringRef::str_abi_cxx11_(&this->Filename,&local_30);
  this->LineNo = Line;
  this->ColumnNo = Col;
  this->Kind = Kind;
  StringRef::str_abi_cxx11_(&this->Message,&Msg);
  StringRef::str_abi_cxx11_(&this->LineContents,&LineStr);
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_>::vec(&this->Ranges,&Ranges);
  SmallVector<llvm::SMFixIt,4u>::SmallVector<llvm::SMFixIt_const*,void>
            (&this->FixIts,Hints.Data,Hints.Data + Hints.Length);
  pvVar1 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
           super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
           super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  std::__sort<llvm::SMFixIt*,__gnu_cxx::__ops::_Iter_less_iter>
            (pvVar1,(void *)((ulong)(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
                                    super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                                    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
                                    super_SmallVectorBase.Size * 0x30 + (long)pvVar1));
  return;
}

Assistant:

SMDiagnostic::SMDiagnostic(const SourceMgr &sm, SMLoc L, StringRef FN,
                           int Line, int Col, SourceMgr::DiagKind Kind,
                           StringRef Msg, StringRef LineStr,
                           ArrayRef<std::pair<unsigned,unsigned>> Ranges,
                           ArrayRef<SMFixIt> Hints)
  : SM(&sm), Loc(L), Filename(FN), LineNo(Line), ColumnNo(Col), Kind(Kind),
    Message(Msg), LineContents(LineStr), Ranges(Ranges.vec()),
    FixIts(Hints.begin(), Hints.end()) {
  llvm::sort(FixIts.begin(), FixIts.end());
}